

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengl_settings.cpp
# Opt level: O0

void update_depth_function(void)

{
  ostream *poVar1;
  
  if (enable_depth_buffer) {
    (*glad_glEnable)(0xb71);
    switch(current_depth_buffer_func) {
    case ALWAYS:
      (*glad_glDepthFunc)(0x207);
      break;
    case NEVER:
      (*glad_glDepthFunc)(0x200);
      break;
    case LESS:
      (*glad_glDepthFunc)(0x201);
      break;
    case EQUAL:
      (*glad_glDepthFunc)(0x202);
      break;
    case LEQUAL:
      (*glad_glDepthFunc)(0x203);
      break;
    case GREATER:
      (*glad_glDepthFunc)(0x204);
      break;
    case NOTEQUAL:
      (*glad_glDepthFunc)(0x205);
      break;
    case GEQUAL:
      (*glad_glDepthFunc)(0x206);
      break;
    default:
      poVar1 = std::operator<<((ostream *)&std::cerr,"unhandled switch case ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x6c);
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/src/misc/opengl_settings.cpp"
                              );
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
  }
  else {
    (*glad_glDisable)(0xb71);
  }
  return;
}

Assistant:

void update_depth_function() noexcept
{
    if (!enable_depth_buffer)
    {
        glDisable(GL_DEPTH_TEST);
        return;
    }

    glEnable(GL_DEPTH_TEST);
    switch (current_depth_buffer_func)
    {
    case DepthFun::ALWAYS:
    {
        glDepthFunc(GL_ALWAYS);
        break;
    };
    case DepthFun::EQUAL:
    {
        glDepthFunc(GL_EQUAL);
        break;
    };
    case DepthFun::GEQUAL:
    {
        glDepthFunc(GL_GEQUAL);
        break;
    };
    case DepthFun::GREATER:
    {
        glDepthFunc(GL_GREATER);
        break;
    };
    case DepthFun::LEQUAL:
    {
        glDepthFunc(GL_LEQUAL);
        break;
    };
    case DepthFun::LESS:
    {
        glDepthFunc(GL_LESS);
        break;
    };
    case DepthFun::NEVER:
    {
        glDepthFunc(GL_NEVER);
        break;
    };
    case DepthFun::NOTEQUAL:
    {
        glDepthFunc(GL_NOTEQUAL);
        break;
    };
    default:
    {
        UNHANDLED_SWITCH_CASE(__LINE__, __FILE__);
    };
    }
}